

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::AtomicMachine::Atomic<unsigned_int>
          (AtomicMachine *this,int target,int stage,GLenum internalformat)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  char *src_vs;
  reference data;
  ivec4 *a;
  undefined8 uVar4;
  CallLogWrapper *this_00;
  Vector<int,_4> local_120;
  string local_110;
  Vector<int,_4> local_ec;
  uint local_dc;
  void *pvStack_d8;
  int i_1;
  ivec4 *out_data;
  undefined1 local_c8 [6];
  bool status;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> b_data;
  GLuint local_a8;
  int i;
  GLuint textures [4];
  int kSize;
  int kTargets;
  GLenum targets [4];
  string local_48;
  char *local_28;
  char *src_fs;
  GLuint program;
  GLenum internalformat_local;
  int stage_local;
  int target_local;
  AtomicMachine *this_local;
  
  src_fs._0_4_ = 0;
  src_fs._4_4_ = internalformat;
  program = stage;
  internalformat_local = target;
  _stage_local = this;
  if (stage == 0) {
    local_28 = "\nvoid main() {\n  discard;\n}";
    GenShader<unsigned_int>(&local_48,this,target,0,internalformat);
    src_vs = (char *)std::__cxx11::string::c_str();
    src_fs._0_4_ = ShaderImageLoadStoreBase::BuildProgram
                             (&this->super_ShaderImageLoadStoreBase,src_vs,local_28,true,false);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else if (stage == 4) {
    GenShader<unsigned_int>((string *)(targets + 2),this,target,4,internalformat);
    src_fs._0_4_ = ShaderImageLoadStoreBase::CreateComputeProgram
                             (&this->super_ShaderImageLoadStoreBase,(string *)(targets + 2),true);
    std::__cxx11::string::~string((string *)(targets + 2));
  }
  _kSize = 0x806f00000de1;
  targets[0] = 0x8513;
  targets[1] = 0x8c1a;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,&local_a8);
  for (b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
      b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           b_data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,
               (&kSize)[b_data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],
               (&local_a8)
               [b_data.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,
               (&kSize)[b_data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,
               (&kSize)[b_data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],0x2800,0x2600);
    if ((&kSize)[b_data.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0xde1) {
      glu::CallLogWrapper::glTexStorage2D
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,
                 (&kSize)[b_data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],1,src_fs._4_4_,
                 100,1);
    }
    else if (((&kSize)[b_data.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0x806f) ||
            ((&kSize)[b_data.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0x8c1a)) {
      glu::CallLogWrapper::glTexStorage3D
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,
                 (&kSize)[b_data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],1,src_fs._4_4_,
                 100,1,2);
    }
    else if ((&kSize)[b_data.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 0x8513) {
      glu::CallLogWrapper::glTexStorage2D
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,
                 (&kSize)[b_data.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],1,src_fs._4_4_,
                 100,100);
    }
  }
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindImageTexture(this_00,1,local_a8,0,'\0',0,0x88ba,src_fs._4_4_);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,i,0,'\x01',0,0x88ba,src_fs._4_4_);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88ba,src_fs._4_4_);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[1],0,'\x01',0,0x88ba,src_fs._4_4_);
  std::allocator<tcu::Vector<int,_4>_>::allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&out_data + 7));
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_c8,100,
             (allocator<tcu::Vector<int,_4>_> *)((long)&out_data + 7));
  std::allocator<tcu::Vector<int,_4>_>::~allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&out_data + 7));
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0,this->m_buffer);
  data = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                   ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_c8,0
                   );
  glu::CallLogWrapper::glBufferData
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0x640,data,0x88e4);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,(GLuint)src_fs);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  if (program == 0) {
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,100);
  }
  else if (program == 4) {
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
  }
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x200);
  out_data._6_1_ = 1;
  pvStack_d8 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x90d2,0,0x640,1);
  for (local_dc = 0; (int)local_dc < 100; local_dc = local_dc + 1) {
    a = (ivec4 *)((long)pvStack_d8 + (long)(int)local_dc * 0x10);
    tcu::Vector<int,_4>::Vector(&local_ec,0,1,0,1);
    bVar3 = ShaderImageLoadStoreBase::Equal(&this->super_ShaderImageLoadStoreBase,a,&local_ec,0);
    uVar1 = local_dc;
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      out_data._6_1_ = 0;
      tcu::Vector<int,_4>::Vector
                (&local_120,(Vector<int,_4> *)((long)pvStack_d8 + (long)(int)local_dc * 0x10));
      glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_110,(ShaderImageLoadStoreBase *)this,&local_120);
      uVar4 = std::__cxx11::string::c_str();
      anon_unknown_0::Output("[%d] Atomic operation check failed. (%s) \n",(ulong)uVar1,uVar4);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,(GLuint)src_fs);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,&local_a8);
  bVar2 = out_data._6_1_;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_c8);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Atomic(int target, int stage, GLenum internalformat)
	{
		GLuint program = 0;
		if (stage == 0)
		{ // VS
			const char* src_fs = NL "void main() {" NL "  discard;" NL "}";
			program			   = BuildProgram(GenShader<T>(target, stage, internalformat).c_str(), src_fs, true, false);
		}
		else if (stage == 4)
		{ // CS
			program = CreateComputeProgram(GenShader<T>(target, stage, internalformat), true);
		}

		const GLenum targets[] = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		const int	kTargets  = sizeof(targets) / sizeof(targets[0]);
		const int	kSize	 = 100;

		GLuint textures[kTargets];
		glGenTextures(kTargets, textures);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			if (targets[i] == GL_TEXTURE_2D)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, kSize, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, kSize);
			}
		}
		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // 3D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // Cube
		glBindImageTexture(3, textures[3], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // 2DArray

		std::vector<ivec4> b_data(kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * 4 * 4, &b_data[0], GL_STATIC_DRAW);

		glUseProgram(program);
		glBindVertexArray(m_vao);
		if (stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		else if (stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool   status   = true;
		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(0, 1, 0, 1), 0))
			{
				status = false;
				Output("[%d] Atomic operation check failed. (%s) \n", i, ToString(out_data[i]).c_str());
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(kTargets, textures);
		return status;
	}